

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonStringReset(JsonString *p)

{
  ulong uVar1;
  long *p_00;
  
  if (p->bStatic == '\0') {
    uVar1 = *(ulong *)(p->zBuf + -8);
    p_00 = (long *)(p->zBuf + -8);
    if (uVar1 < 2) {
      sqlite3_free(p_00);
    }
    else {
      *p_00 = uVar1 - 1;
    }
  }
  p->zBuf = p->zSpace;
  p->nAlloc = 100;
  p->nUsed = 0;
  p->bStatic = '\x01';
  return;
}

Assistant:

static void jsonStringReset(JsonString *p){
  if( !p->bStatic ) sqlite3RCStrUnref(p->zBuf);
  jsonStringZero(p);
}